

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

int match_digits(int *acc,char **str,size_t *len,char *tpl,date_parse_string *capture)

{
  char cVar1;
  byte bVar2;
  byte *pbVar3;
  size_t sVar4;
  int iVar5;
  
  pbVar3 = (byte *)*str;
  sVar4 = *len;
  *acc = 0;
  iVar5 = 0;
  do {
    cVar1 = *tpl;
    if (cVar1 == ',') {
      tpl = tpl + -1;
      if ((sVar4 == 0) || ((*pbVar3 | 2) != 0x2e)) {
        pbVar3 = pbVar3 + -1;
        sVar4 = sVar4 + 1;
      }
    }
    else {
      if (cVar1 == '\0') {
        capture->p = *str;
        capture->len = (long)pbVar3 - (long)*str;
        *str = (char *)pbVar3;
        *len = sVar4;
        return 1;
      }
      if (sVar4 == 0) {
        return 0;
      }
      bVar2 = *pbVar3;
      if ((char)bVar2 < cVar1) {
        return 0;
      }
      if ((int)(char)bVar2 - 0x3aU < 0xfffffff6) {
        return 0;
      }
      if (tpl[1] < (char)bVar2) {
        return 0;
      }
      *acc = iVar5 * 10;
      iVar5 = (int)(char)*pbVar3 + iVar5 * 10 + -0x30;
      *acc = iVar5;
    }
    tpl = tpl + 2;
    pbVar3 = pbVar3 + 1;
    sVar4 = sVar4 - 1;
  } while( true );
}

Assistant:

static int match_digits(int &acc, const char *&str, size_t &len,
                        const char *tpl, date_parse_string &capture)
{
    /* set up a private pointer to the string */
    const char *p = str;
    size_t rem = len;

    /* match each template pair */
    acc = 0;
    for ( ; *tpl != '\0' ; tpl += 2, ++p, --rem)
    {
        /* check for the special match to a period or comma */
        if (*tpl == ',')
        {
            /* back up to make up for the normal double increment */
            --tpl;
            
            /* allow it to match, but don't require it */
            if (rem != 0 && (*p == ',' || *p == '.'))
                continue;

            /* it doesn't match; simply say on the same input character */
            --p, ++rem;
            continue;
        }
        
        /* if this input char isn't a digit, we don't have a match */
        if (rem == 0 || !is_digit(*p))
            return FALSE;

        /* if this digit is out of range, it's not a match */
        if (*p < tpl[0] || *p > tpl[1])
            return FALSE;

        /* matched this digit - add it to the accumulator */
        acc *= 10;
        acc += value_of_digit(*p);
    }

    /* set the capture data */
    capture.p = str;
    capture.len = p - str;

    /* advance the caller's string pointers past the match */
    str = p;
    len = rem;

    /* return success */
    return TRUE;
}